

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O2

People * __thiscall tcmalloc::FixedAllocator<People>::Alloc(FixedAllocator<People> *this)

{
  void *result;
  People *pPVar1;
  uint64_t uVar2;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,"T *tcmalloc::FixedAllocator<People>::Alloc() [T = People]");
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  else {
    pPVar1 = (People *)this->freelist_;
    if (pPVar1 != (People *)0x0) {
      this->freelist_ = (void *)*pPVar1;
      return pPVar1;
    }
  }
  if (this->area_free_ < 8) {
    pPVar1 = (People *)SystemAlloc(0x8000000);
    if (pPVar1 == (People *)0xffffffffffffffff) {
      return (People *)0x0;
    }
    uVar2 = 0x7fffff8;
  }
  else {
    pPVar1 = (People *)this->area_;
    uVar2 = this->area_free_ - 8;
  }
  this->area_ = (char *)(pPVar1 + 1);
  this->area_free_ = uVar2;
  return pPVar1;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }